

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswLcorr.c
# Opt level: O2

int Ssw_ManSweepLatch(Ssw_Man_t *p)

{
  uint uVar1;
  Aig_Man_t *pAVar2;
  void *pvVar3;
  Aig_Obj_t *pAVar4;
  void **ppvVar5;
  long lVar6;
  Vec_Ptr_t *pVVar7;
  Aig_Obj_t *pAVar8;
  Ssw_Sat_t *pSVar9;
  int iVar10;
  ulong uVar11;
  Aig_Obj_t *pAVar12;
  int nWords;
  Aig_Obj_t **ppAVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  
  pAVar2 = Aig_ManStart(p->pAig->vObjs->nSize);
  p->pFrames = pAVar2;
  uVar16 = (ulong)p->nFrames;
  p->pNodeToFrames[(long)p->pAig->pConst1->Id * uVar16] = pAVar2->pConst1;
  for (iVar14 = 0; pAVar2 = p->pAig, iVar14 < pAVar2->nTruePis; iVar14 = iVar14 + 1) {
    pvVar3 = Vec_PtrEntry(pAVar2->vCis,iVar14);
    pAVar4 = Aig_ObjCreateCi(p->pFrames);
    uVar16 = (long)*(int *)((long)pvVar3 + 0x24) * (long)p->nFrames;
    p->pNodeToFrames[uVar16] = pAVar4;
  }
  for (iVar14 = 0; iVar14 < pAVar2->nRegs; iVar14 = iVar14 + 1) {
    pvVar3 = Vec_PtrEntry(pAVar2->vCis,pAVar2->nTruePis + iVar14);
    ppAVar13 = p->pAig->pReprs;
    if (ppAVar13 == (Aig_Obj_t **)0x0) {
LAB_0056362b:
      pAVar4 = Aig_ObjCreateCi(p->pFrames);
      (pAVar4->field_5).pData = pvVar3;
      ppAVar13 = p->pNodeToFrames;
      uVar16 = (ulong)(uint)p->nFrames;
      iVar10 = *(int *)((long)pvVar3 + 0x24);
    }
    else {
      iVar10 = *(int *)((long)pvVar3 + 0x24);
      pAVar4 = ppAVar13[iVar10];
      if (pAVar4 == (Aig_Obj_t *)0x0) goto LAB_0056362b;
      ppAVar13 = p->pNodeToFrames;
      uVar16 = (ulong)p->nFrames;
      pAVar4 = (Aig_Obj_t *)
               ((ulong)((*(uint *)((long)pvVar3 + 0x18) ^ *(uint *)&pAVar4->field_0x18) >> 3 & 1) ^
               (ulong)ppAVar13[(long)pAVar4->Id * uVar16]);
    }
    ppAVar13[iVar10 * (int)uVar16] = pAVar4;
    pAVar2 = p->pAig;
  }
  Aig_ManSetCioIds(p->pFrames);
  if (p->vSimInfo != (Vec_Ptr_t *)0x0) {
    __assert_fail("p->vSimInfo == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswLcorr.c"
                  ,0x10c,"int Ssw_ManSweepLatch(Ssw_Man_t *)");
  }
  uVar1 = p->pFrames->nObjs[2];
  ppvVar5 = (void **)malloc((long)(int)uVar1 * 0xc);
  lVar6 = 0;
  uVar11 = 0;
  if (0 < (int)uVar1) {
    uVar11 = (ulong)uVar1;
  }
  for (; iVar14 = (int)uVar16, uVar11 * 4 != lVar6; lVar6 = lVar6 + 4) {
    uVar16 = (long)ppvVar5 + lVar6 + (long)(int)uVar1 * 8;
    *(ulong *)((long)ppvVar5 + lVar6 * 2) = uVar16;
  }
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  pVVar7->nSize = uVar1;
  pVVar7->nCap = uVar1;
  pVVar7->pArray = ppvVar5;
  p->vSimInfo = pVVar7;
  Vec_PtrCleanSimInfo(pVVar7,iVar14,nWords);
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  pVVar7->pArray = ppvVar5;
  p->fRefined = 0;
  p->nCallsSat = 0;
  p->nCallsUnsat = 0;
  p->nCallsCount = 0;
  iVar14 = 0;
  do {
    pAVar2 = p->pAig;
    if (pAVar2->nRegs <= iVar14) {
      if (0 < p->nPatterns) {
        Ssw_ManSweepResimulate(p);
      }
      free(pVVar7->pArray);
      free(pVVar7);
      return p->fRefined;
    }
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAVar2->vCis,pAVar2->nTruePis + iVar14);
    ppAVar13 = p->pAig->pReprs;
    if (ppAVar13 == (Aig_Obj_t **)0x0) {
      pAVar8 = (Aig_Obj_t *)0x0;
    }
    else {
      pAVar8 = ppAVar13[pAVar4->Id];
    }
    pAVar12 = p->pAig->pConst1;
    if (pAVar8 == pAVar12) {
      Ssw_ManSweepLatchOne(p,pAVar12,pAVar4);
LAB_005637b4:
      if (p->nPatterns == 0x20) {
LAB_005637ba:
        Ssw_ManSweepResimulate(p);
      }
      iVar10 = p->pPars->nSatVarMax;
      if (iVar10 != 0) {
        pSVar9 = p->pMSat;
        iVar15 = pSVar9->nSatVars;
        if ((iVar10 < iVar15) && (p->pPars->nRecycleCalls < p->nRecycleCalls)) {
          if (iVar15 < p->nVarsMax) {
            iVar15 = p->nVarsMax;
          }
          p->nVarsMax = iVar15;
          iVar10 = pSVar9->nSolverCalls;
          if (pSVar9->nSolverCalls < p->nCallsMax) {
            iVar10 = p->nCallsMax;
          }
          p->nCallsMax = iVar10;
          Ssw_SatStop(pSVar9);
          pSVar9 = Ssw_SatStart(0);
          p->pMSat = pSVar9;
          p->nRecycles = p->nRecycles + 1;
          p->nRecycleCalls = 0;
        }
      }
    }
    else {
      Ssw_ClassesCollectClass(p->ppClasses,pAVar4,pVVar7);
      iVar10 = pVVar7->nSize;
      if (iVar10 != 0) {
        for (iVar15 = 0; iVar15 < iVar10; iVar15 = iVar15 + 1) {
          pAVar8 = (Aig_Obj_t *)Vec_PtrEntry(pVVar7,iVar15);
          ppAVar13 = p->pAig->pReprs;
          if (ppAVar13 == (Aig_Obj_t **)0x0) {
            pAVar12 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar12 = ppAVar13[pAVar8->Id];
          }
          if (pAVar12 == pAVar4) {
            Ssw_ManSweepLatchOne(p,pAVar4,pAVar8);
            if (p->nPatterns == 0x20) goto LAB_005637ba;
          }
          iVar10 = pVVar7->nSize;
        }
        goto LAB_005637b4;
      }
    }
    iVar14 = iVar14 + 1;
  } while( true );
}

Assistant:

int Ssw_ManSweepLatch( Ssw_Man_t * p )
{
//    Bar_Progress_t * pProgress = NULL;
    Vec_Ptr_t * vClass;
    Aig_Obj_t * pObj, * pRepr, * pTemp;
    int i, k;

    // start the timeframe
    p->pFrames = Aig_ManStart( Aig_ManObjNumMax(p->pAig) );
    // map constants and PIs
    Ssw_ObjSetFrame( p, Aig_ManConst1(p->pAig), 0, Aig_ManConst1(p->pFrames) );
    Saig_ManForEachPi( p->pAig, pObj, i )
        Ssw_ObjSetFrame( p, pObj, 0, Aig_ObjCreateCi(p->pFrames) );

    // implement equivalence classes
    Saig_ManForEachLo( p->pAig, pObj, i )
    {
        pRepr = Aig_ObjRepr( p->pAig, pObj );
        if ( pRepr == NULL )
        {
            pTemp = Aig_ObjCreateCi(p->pFrames);
            pTemp->pData = pObj;
        }
        else
            pTemp = Aig_NotCond( Ssw_ObjFrame(p, pRepr, 0), pRepr->fPhase ^ pObj->fPhase );
        Ssw_ObjSetFrame( p, pObj, 0, pTemp );
    }
    Aig_ManSetCioIds( p->pFrames );

    // prepare simulation info
    assert( p->vSimInfo == NULL );
    p->vSimInfo = Vec_PtrAllocSimInfo( Aig_ManCiNum(p->pFrames), 1 );
    Vec_PtrCleanSimInfo( p->vSimInfo, 0, 1 );

    // go through the registers
//    if ( p->pPars->fVerbose )
//        pProgress = Bar_ProgressStart( stdout, Aig_ManRegNum(p->pAig) );
    vClass = Vec_PtrAlloc( 100 );
    p->fRefined = 0;
    p->nCallsCount = p->nCallsSat = p->nCallsUnsat = 0;
    Saig_ManForEachLo( p->pAig, pObj, i )
    {
//        if ( p->pPars->fVerbose )
//            Bar_ProgressUpdate( pProgress, i, NULL );
        // consider the case of constant candidate
        if ( Ssw_ObjIsConst1Cand( p->pAig, pObj ) )
            Ssw_ManSweepLatchOne( p, Aig_ManConst1(p->pAig), pObj );
        else
        {
            // consider the case of equivalence class
            Ssw_ClassesCollectClass( p->ppClasses, pObj, vClass );
            if ( Vec_PtrSize(vClass) == 0 )
                continue;
            // try to prove equivalences in this class
            Vec_PtrForEachEntry( Aig_Obj_t *, vClass, pTemp, k )
                if ( Aig_ObjRepr(p->pAig, pTemp) == pObj )
                {
                    Ssw_ManSweepLatchOne( p, pObj, pTemp );
                    if ( p->nPatterns == 32 )
                        break;
                }
        }
        // resimulate
        if ( p->nPatterns == 32 )
            Ssw_ManSweepResimulate( p );
        // attempt recycling the SAT solver
        if ( p->pPars->nSatVarMax &&
             p->pMSat->nSatVars > p->pPars->nSatVarMax &&
             p->nRecycleCalls > p->pPars->nRecycleCalls )
        {
            p->nVarsMax  = Abc_MaxInt( p->nVarsMax,  p->pMSat->nSatVars );
            p->nCallsMax = Abc_MaxInt( p->nCallsMax, p->pMSat->nSolverCalls );
            Ssw_SatStop( p->pMSat );
            p->pMSat = Ssw_SatStart( 0 );
            p->nRecycles++;
            p->nRecycleCalls = 0;
        }
    }
//    ABC_PRT( "reduce", p->timeReduce );
//    Aig_TableProfile( p->pFrames );
//    Abc_Print( 1, "And gates = %d\n", Aig_ManNodeNum(p->pFrames) );
    // resimulate
    if ( p->nPatterns > 0 )
        Ssw_ManSweepResimulate( p );
    // cleanup
    Vec_PtrFree( vClass );
//    if ( p->pPars->fVerbose )
//        Bar_ProgressStop( pProgress );

    // cleanup
//    Ssw_ClassesCheck( p->ppClasses );
    return p->fRefined;
}